

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

uint32_t __thiscall TldAddressAsKey::Hash(TldAddressAsKey *this)

{
  uint32_t uVar1;
  size_t sVar2;
  
  uVar1 = this->hash;
  if (uVar1 == 0) {
    this->hash = 0xcacab0b0;
    uVar1 = 0xcacab0b0;
    if (this->tld_len != 0) {
      sVar2 = 0;
      do {
        uVar1 = (uint)this->tld[sVar2] + uVar1 * 0x65;
        this->hash = uVar1;
        sVar2 = sVar2 + 1;
      } while (this->tld_len != sVar2);
    }
    if (this->addr_len != 0) {
      sVar2 = 0;
      do {
        uVar1 = (uint)this->addr[sVar2] + uVar1 * 0x65;
        this->hash = uVar1;
        sVar2 = sVar2 + 1;
      } while (this->addr_len != sVar2);
    }
  }
  return uVar1;
}

Assistant:

uint32_t TldAddressAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xCACAB0B0;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }

        for (size_t i = 0; i < addr_len; i++)
        {
            hash = hash * 101 + addr[i];
        }
    }

    return hash;
}